

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void setptmode_all(global_State *g,GCproto *pt,int mode)

{
  GCproto *pt_00;
  undefined4 in_EDX;
  global_State *in_RSI;
  GCobj *o;
  ptrdiff_t i;
  global_State *g_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (((in_RSI->gc).threshold & 0x100) != 0) {
    for (g_00 = (global_State *)-(ulong)*(uint *)&in_RSI->allocd; (long)g_00 < 0;
        g_00 = (global_State *)((long)&g_00->strhash + 1)) {
      pt_00 = (GCproto *)(ulong)*(uint *)((ulong)*(uint *)&in_RSI->allocf + (long)g_00 * 4);
      if (pt_00->gct == '\a') {
        setptmode(g_00,pt_00,0);
        setptmode_all(in_RSI,(GCproto *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                      (int)((ulong)g_00 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

static void setptmode_all(global_State *g, GCproto *pt, int mode)
{
  ptrdiff_t i;
  if (!(pt->flags & PROTO_CHILD)) return;
  for (i = -(ptrdiff_t)pt->sizekgc; i < 0; i++) {
    GCobj *o = proto_kgc(pt, i);
    if (o->gch.gct == ~LJ_TPROTO) {
      setptmode(g, gco2pt(o), mode);
      setptmode_all(g, gco2pt(o), mode);
    }
  }
}